

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **azData,sqlite_int64 *pRowid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  sqlite3_int64 sVar4;
  sqlite3_int64 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  Rtree *in_RDI;
  RtreeValue RVar5;
  RtreeNode **in_stack_00000008;
  int rc2;
  RtreeNode *pLeaf;
  RtreeCell *in_stack_00000018;
  int steprc;
  int ii;
  int bHaveRowid;
  RtreeCell cell;
  int rc;
  Rtree *pRtree;
  Rtree *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  RtreeNode *pNode;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_68;
  sqlite3_int64 local_60;
  sqlite3_stmt *in_stack_ffffffffffffffa8;
  Rtree *in_stack_ffffffffffffffb0;
  int local_2c;
  
  local_2c = 0;
  bVar1 = false;
  rtreeReference(in_RDI);
  local_60 = 0;
  if (1 < in_ESI) {
    if (in_RDI->eCoordType == '\0') {
      for (local_68 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
          local_68 < (int)((uint)in_RDI->nDim * 2); local_68 = local_68 + 2) {
        RVar5 = rtreeValueDown((sqlite3_value *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        *(RtreeValue *)(&stack0xffffffffffffffa8 + (long)local_68 * 4) = RVar5;
        RVar5 = rtreeValueUp((sqlite3_value *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        *(RtreeValue *)(&stack0xffffffffffffffa8 + (long)(local_68 + 1) * 4) = RVar5;
        if (*(float *)(&stack0xffffffffffffffa8 + (long)(local_68 + 1) * 4) <=
            *(float *)(&stack0xffffffffffffffa8 + (long)local_68 * 4) &&
            *(float *)(&stack0xffffffffffffffa8 + (long)local_68 * 4) !=
            *(float *)(&stack0xffffffffffffffa8 + (long)(local_68 + 1) * 4)) {
          local_2c = 0x13;
          goto LAB_001d2e67;
        }
      }
    }
    else {
      for (local_68 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
          local_68 < (int)((uint)in_RDI->nDim * 2); local_68 = local_68 + 2) {
        iVar3 = sqlite3_value_int((sqlite3_value *)0x1d2c29);
        *(int *)(&stack0xffffffffffffffa8 + (long)local_68 * 4) = iVar3;
        iVar3 = sqlite3_value_int((sqlite3_value *)0x1d2c4c);
        *(int *)(&stack0xffffffffffffffa8 + (long)(local_68 + 1) * 4) = iVar3;
        if (*(int *)(&stack0xffffffffffffffa8 + (long)(local_68 + 1) * 4) <
            *(int *)(&stack0xffffffffffffffa8 + (long)local_68 * 4)) {
          local_2c = 0x13;
          goto LAB_001d2e67;
        }
      }
    }
    iVar2 = sqlite3_value_type((sqlite3_value *)in_RDX[2]);
    if (iVar2 != 5) {
      local_60 = sqlite3_value_int64((sqlite3_value *)0x1d2cba);
      iVar2 = sqlite3_value_type((sqlite3_value *)*in_RDX);
      if ((iVar2 == 5) ||
         (sVar4 = sqlite3_value_int64((sqlite3_value *)0x1d2cde), sVar4 != local_60)) {
        sqlite3_bind_int64((sqlite3_stmt *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar3,
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        in_stack_ffffffffffffff94 = sqlite3_step(in_stack_ffffffffffffffa8);
        local_2c = sqlite3_reset((sqlite3_stmt *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (in_stack_ffffffffffffff94 == 100) {
          iVar3 = sqlite3_vtab_on_conflict(in_RDI->db);
          if (iVar3 != 5) {
            local_2c = 0x13;
            goto LAB_001d2e67;
          }
          local_2c = rtreeDeleteRowid(in_stack_ffffffffffffffb0,
                                      (sqlite3_int64)in_stack_ffffffffffffffa8);
        }
      }
      bVar1 = true;
    }
  }
  iVar3 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  if (iVar3 != 5) {
    in_stack_ffffffffffffff78 = in_RDI;
    sqlite3_value_int64((sqlite3_value *)0x1d2d9b);
    local_2c = rtreeDeleteRowid(in_stack_ffffffffffffffb0,(sqlite3_int64)in_stack_ffffffffffffffa8);
  }
  if ((local_2c == 0) && (1 < in_ESI)) {
    pNode = (RtreeNode *)0x0;
    if (!bVar1) {
      local_2c = newRowid((Rtree *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (i64 *)in_stack_ffffffffffffff78);
    }
    *in_RCX = local_60;
    if (local_2c == 0) {
      local_2c = ChooseLeaf(_ii,in_stack_00000018,pLeaf._4_4_,in_stack_00000008);
    }
    if (local_2c == 0) {
      in_RDI->iReinsertHeight = -1;
      local_2c = rtreeInsertCell((Rtree *)CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),pNode,
                                 (RtreeCell *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      iVar3 = nodeRelease((Rtree *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (RtreeNode *)in_stack_ffffffffffffff78);
      if (local_2c == 0) {
        local_2c = iVar3;
      }
    }
  }
LAB_001d2e67:
  rtreeRelease((Rtree *)0x1d2e71);
  return local_2c;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **azData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;

    /* Populate the cell.aCoord[] array. The first coordinate is azData[3]. */
    assert( nData==(pRtree->nDim*2 + 3) );
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<(pRtree->nDim*2); ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(azData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(azData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = SQLITE_CONSTRAINT;
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<(pRtree->nDim*2); ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(azData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(azData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = SQLITE_CONSTRAINT;
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(azData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(azData[2]);
      if( sqlite3_value_type(azData[0])==SQLITE_NULL
       || sqlite3_value_int64(azData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = SQLITE_CONSTRAINT;
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If azData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(azData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(azData[0]));
  }

  /* If the azData[] array contains more than one element, elements
  ** (azData[2]..azData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = newRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}